

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::source_linenum_formatter<spdlog::details::scoped_padder>::format
          (source_linenum_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  format_decimal_result<char_*> fVar4;
  scoped_padder p;
  scoped_padder local_60;
  char local_38 [21];
  char acStack_23 [3];
  char *local_20;
  
  uVar1 = (msg->source).line;
  if ((long)(int)uVar1 < 1) {
    scoped_padder::scoped_padder(&local_60,0,&(this->super_flag_formatter).padinfo_,dest);
  }
  else {
    uVar2 = 0x1f;
    if ((uVar1 | 1) != 0) {
      for (; (uVar1 | 1) >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    scoped_padder::scoped_padder
              (&local_60,
               (ulong)((long)(int)uVar1 +
                      *(long *)(fmt::v10::detail::do_count_digits(unsigned_int)::table +
                               (ulong)uVar2 * 8)) >> 0x20,&(this->super_flag_formatter).padinfo_,
               dest);
    uVar1 = (msg->source).line;
    uVar2 = -uVar1;
    if (0 < (int)uVar1) {
      uVar2 = uVar1;
    }
    fVar4 = fmt::v10::detail::format_decimal<char,unsigned_int>(local_38,uVar2,0x15);
    local_20 = fVar4.begin;
    if ((int)uVar1 < 0) {
      local_20[-1] = '-';
      local_20 = local_20 + -1;
    }
    lVar3 = (long)local_38 - (long)local_20;
    if (lVar3 < -0x15) {
      fmt::v10::detail::assert_fail
                ("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
                 ,0x189,"negative value");
    }
    fmt::v10::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,local_20,local_20 + lVar3 + 0x15);
  }
  scoped_padder::~scoped_padder(&local_60);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override {
        if (msg.source.empty()) {
            ScopedPadder p(0, padinfo_, dest);
            return;
        }

        auto field_size = ScopedPadder::count_digits(msg.source.line);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(msg.source.line, dest);
    }